

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void threadMain(void *param)

{
  uint uVar1;
  int local_54;
  int secondTryCheckSum;
  int threadNum;
  double totalParsesCompleted;
  int checkSum;
  InFileInfo *fInfo;
  int local_24;
  ThreadParser *pTStack_20;
  int docNum;
  ThreadParser *thParser;
  ThreadInfo *thInfo;
  void *param_local;
  
  pTStack_20 = (ThreadParser *)0x0;
  if (gRunInfo.verbose) {
    printf("Thread #%d: starting\n",(ulong)*(uint *)((long)param + 8));
  }
  local_24 = gRunInfo.numInputFiles;
  do {
    while( true ) {
      if ((gRunInfo.stopNow & 1U) != 0) {
        if (pTStack_20 != (ThreadParser *)0x0) {
          ThreadParser::~ThreadParser(pTStack_20);
          operator_delete(pTStack_20,0x40);
        }
        return;
      }
      if ((gRunInfo.numParses == 0) || (*(uint *)((long)param + 4) < gRunInfo.numParses)) break;
      ThreadFuncs::Sleep(1000);
    }
    *(undefined1 *)((long)param + 1) = 1;
    if (pTStack_20 == (ThreadParser *)0x0) {
      pTStack_20 = (ThreadParser *)operator_new(0x40);
      ThreadParser::ThreadParser(pTStack_20);
    }
    local_24 = local_24 + 1;
    if (gRunInfo.numInputFiles <= local_24) {
      local_24 = 0;
    }
    if ((gRunInfo.verbose & 1U) != 0) {
      printf("Thread #%d: parse %d starting file %s\n",(ulong)*(uint *)((long)param + 8),
             (ulong)*(uint *)((long)param + 4),gRunInfo.files[local_24].fileName);
    }
    totalParsesCompleted._4_4_ = ThreadParser::parse(pTStack_20,local_24);
    if (gRunInfo.files[local_24].checkSum == 0) {
      gRunInfo.files[local_24].checkSum = totalParsesCompleted._4_4_;
    }
    else if (totalParsesCompleted._4_4_ != gRunInfo.files[local_24].checkSum) {
      if (totalParsesCompleted._4_4_ == 0) {
        totalParsesCompleted._4_4_ = ThreadParser::getCheckSum(pTStack_20);
      }
      fprintf(_stderr,
              "\nThread %d: Parse Check sum error on file  \"%s\" for parse # %d.  Expected %x,  got %x\n"
              ,(ulong)*(uint *)((long)param + 8),gRunInfo.files[local_24].fileName,
              (ulong)*(uint *)((long)param + 4),(ulong)(uint)gRunInfo.files[local_24].checkSum,
              totalParsesCompleted._4_4_);
      _secondTryCheckSum = 0.0;
      for (local_54 = 0; local_54 < gRunInfo.numThreads; local_54 = local_54 + 1) {
        _secondTryCheckSum = (double)gThreadInfo[local_54].fParses + _secondTryCheckSum;
      }
      fprintf(_stderr,"Total number of parses completed is %f.\n",_secondTryCheckSum);
      uVar1 = ThreadParser::reCheck(pTStack_20);
      fprintf(_stderr,"   Retry checksum is %x\n",(ulong)uVar1);
      if (((gRunInfo.dumpOnErr & 1U) != 0) && ((gRunInfo.dom & 1U) != 0)) {
        ThreadParser::domPrint(pTStack_20);
      }
      fflush(_stdout);
      fflush(_stderr);
      clearFileInfoMemory();
      exit(-1);
    }
    if ((gRunInfo.reuseParser & 1U) == 0) {
      if (pTStack_20 != (ThreadParser *)0x0) {
        ThreadParser::~ThreadParser(pTStack_20);
        operator_delete(pTStack_20,0x40);
      }
      pTStack_20 = (ThreadParser *)0x0;
    }
    *(undefined1 *)param = 1;
    *(int *)((long)param + 4) = *(int *)((long)param + 4) + 1;
    *(undefined1 *)((long)param + 1) = 0;
  } while( true );
}

Assistant:

unsigned long WINAPI threadMain (void *param)
#endif
{
    ThreadInfo   *thInfo = (ThreadInfo *)param;
    ThreadParser *thParser = 0;

    if (gRunInfo.verbose)
        printf("Thread #%d: starting\n", thInfo->fThreadNum);

    int docNum = gRunInfo.numInputFiles;

    //
    // Each time through this loop, one file will be parsed and its checksum
    // computed and compared with the precomputed value for that file.
    //
    while (gRunInfo.stopNow == false) {
        if (gRunInfo.numParses == 0 || thInfo->fParses < gRunInfo.numParses) {
            thInfo->fInProgress = true;

            if (thParser == 0)
                thParser = new ThreadParser;

            docNum++;

            if (docNum >= gRunInfo.numInputFiles)
                docNum = 0;

            InFileInfo *fInfo = &gRunInfo.files[docNum];

            if (gRunInfo.verbose )
                printf("Thread #%d: parse %d starting file %s\n", thInfo->fThreadNum, thInfo->fParses, fInfo->fileName);

            int checkSum = 0;

            checkSum = thParser->parse(docNum);

            // For the case where we skip the preparse we will have nothing to
            // compare the first parse's results to ... so if this looks like first
            // parse move the checkSum back into the gRunInfo data for this file.

            if (gRunInfo.files[docNum].checkSum == 0) {
                gRunInfo.files[docNum].checkSum = checkSum;
            }
            else if (checkSum != gRunInfo.files[docNum].checkSum) {
                if (checkSum == 0) {
                    // parse returns 0 if there was an error so do this to get the real
                    // checksum value
                    checkSum = thParser->getCheckSum();
                }
                fprintf(stderr, "\nThread %d: Parse Check sum error on file  \"%s\" for parse # %d.  Expected %x,  got %x\n",
                    thInfo->fThreadNum, fInfo->fileName, thInfo->fParses, fInfo->checkSum, checkSum);

	            double totalParsesCompleted = 0;
                for (int threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
                    totalParsesCompleted += gThreadInfo[threadNum].fParses;
                }
                fprintf(stderr, "Total number of parses completed is %f.\n", totalParsesCompleted);

                // Revisit - let the loop continue to run?
                int secondTryCheckSum = thParser->reCheck();
                fprintf(stderr, "   Retry checksum is %x\n", secondTryCheckSum);
                if (gRunInfo.dumpOnErr && gRunInfo.dom) {
                    thParser->domPrint();
                }
                fflush(stdout);
                fflush(stderr);
                clearFileInfoMemory();
                exit(-1);
            }

            if (gRunInfo.reuseParser == false) {
                delete thParser;
                thParser = 0;
            }

            thInfo->fHeartBeat = true;
            thInfo->fParses++;
            thInfo->fInProgress = false;
        }
        else {
            ThreadFuncs::Sleep(1000);
        }
    }
    delete thParser;
#ifdef HAVE_PTHREAD
	return;
}
#else
    return 0;
#endif
}